

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_dump.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
::phmap_load<phmap::BinaryInputArchive>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
           *this,BinaryInputArchive *ar)

{
  size_t version;
  slot_type *local_40;
  size_t sStack_38;
  size_t local_30;
  _Head_base<0UL,_unsigned_long,_false> local_20;
  
  version = (size_t)EmptyGroup<std::is_same<std::allocator<unsigned_int>,std::allocator<unsigned_int>>>()
                    ::empty_group;
  local_20._M_head_impl = 0;
  local_40 = (slot_type *)0x0;
  sStack_38 = 0;
  local_30 = 0;
  swap((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
        *)&version,this);
  ~raw_hash_set((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&version);
  version = 0;
  BinaryInputArchive::loadBinary(ar,&version,8);
  if (version < 0xfffffffffffffff5) {
    this->size_ = version;
  }
  else {
    BinaryInputArchive::loadBinary(ar,&this->size_,8);
  }
  BinaryInputArchive::loadBinary(ar,&this->capacity_,8);
  if (this->capacity_ != 0) {
    initialize_slots(this,this->capacity_);
  }
  if (this->size_ != 0) {
    BinaryInputArchive::loadBinary(ar,this->ctrl_,this->capacity_ + 0x11);
    BinaryInputArchive::loadBinary(ar,this->slots_,this->capacity_ << 2);
    if (version < 0xfffffffffffffff5) {
      drop_deletes_without_resize(this);
    }
    else {
      BinaryInputArchive::loadBinary(ar,&this->settings_,8);
    }
  }
  return true;
}

Assistant:

bool raw_hash_set<Policy, Hash, Eq, Alloc>::phmap_load(InputArchive& ar) {
    static_assert(type_traits_internal::IsTriviallyCopyable<value_type>::value,
                    "value_type should be trivially copyable");
    raw_hash_set<Policy, Hash, Eq, Alloc>().swap(*this); // clear any existing content

    size_t version = 0;
    ar.loadBinary(&version, sizeof(size_t));
    if (version < s_version_base) {
        // we didn't store the version, version actually contains the size
        size_ = version;
    } else {
        ar.loadBinary(&size_, sizeof(size_t));
    }
    ar.loadBinary(&capacity_, sizeof(size_t));

    if (capacity_) {
        // allocate memory for ctrl_ and slots_
        initialize_slots(capacity_);
    }
    if (size_ == 0)
        return true;
    ar.loadBinary(ctrl_,  sizeof(ctrl_t) * (capacity_ + Group::kWidth + 1));
    ar.loadBinary(slots_, sizeof(slot_type) * capacity_);
    if (version >= s_version_base) {
        // growth_left should be restored after calling initialize_slots() which resets it.
        ar.loadBinary(&growth_left(), sizeof(size_t));
    } else {
       drop_deletes_without_resize();
    }
    return true;
}